

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_15::BinaryReaderIR::OnEndExpr(BinaryReaderIR *this)

{
  Offset OVar1;
  Result RVar2;
  char *pcVar3;
  size_t sVar4;
  pointer pLVar5;
  char *pcVar6;
  pointer pLVar7;
  Expr *expr;
  LabelNode *label;
  Expr *local_28;
  LabelNode *local_20;
  
  pLVar7 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar5 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)(((long)pLVar5 - (long)pLVar7 >> 3) * -0x5555555555555555) < 2) goto LAB_001c7bb9;
  RVar2 = TopLabelExpr(this,&local_20,&local_28);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  switch(local_20->label_type) {
  case Block:
    if (local_28->type_ != Block) {
      pcVar6 = 
      "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
      ;
      goto LAB_001c7c16;
    }
    break;
  case Loop:
    if (local_28->type_ != Loop) {
      pcVar6 = 
      "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
      ;
      goto LAB_001c7c16;
    }
    break;
  case If:
    if (local_28->type_ != If) {
LAB_001c7bea:
      pcVar6 = "Derived *wabt::cast(Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
LAB_001c7c16:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                    ,0x4e,pcVar6);
    }
    break;
  case Else:
    if (local_28->type_ != If) goto LAB_001c7bea;
    pcVar6 = this->filename_;
    pcVar3 = (char *)strlen(pcVar6);
    OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    local_28[6].loc.filename._M_str = pcVar3;
    local_28[6].loc.field_1.field_1.offset = (size_t)pcVar6;
    *(Offset *)((long)&local_28[6].loc.field_1 + 8) = OVar1;
    local_28 = (Expr *)&local_28[6].type_;
    goto LAB_001c7baa;
  case Try:
    if (local_28->type_ != Try) {
      pcVar6 = "Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]";
      goto LAB_001c7c16;
    }
    break;
  default:
    goto switchD_001c7aca_default;
  }
  pcVar6 = this->filename_;
  sVar4 = strlen(pcVar6);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_28[5].loc.field_1.field_1.offset = sVar4;
  *(char **)((long)&local_28[5].loc.field_1 + 8) = pcVar6;
  *(Offset *)&local_28[5].type_ = OVar1;
  local_28 = local_28 + 6;
LAB_001c7baa:
  *(ExprType *)&local_28->_vptr_Expr = AtomicLoad;
switchD_001c7aca_default:
  pLVar7 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar5 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_001c7bb9:
  if (pLVar5 == pLVar7) {
    PrintError(this,"popping empty label stack");
    return (Result)Error;
  }
  (this->label_stack_).
  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = pLVar5 + -1;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnEndExpr() {
  if (label_stack_.size() > 1) {
    LabelNode* label;
    Expr* expr;
    CHECK_RESULT(TopLabelExpr(&label, &expr));
    switch (label->label_type) {
      case LabelType::Block:
        cast<BlockExpr>(expr)->block.end_loc = GetLocation();
        break;
      case LabelType::Loop:
        cast<LoopExpr>(expr)->block.end_loc = GetLocation();
        break;
      case LabelType::If:
        cast<IfExpr>(expr)->true_.end_loc = GetLocation();
        break;
      case LabelType::Else:
        cast<IfExpr>(expr)->false_end_loc = GetLocation();
        break;
      case LabelType::Try:
        cast<TryExpr>(expr)->block.end_loc = GetLocation();
        break;

      case LabelType::InitExpr:
      case LabelType::Func:
      case LabelType::Catch:
        break;
    }
  }

  return PopLabel();
}